

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log_test.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_ce1d0::DepsLogTestTruncated::Run(DepsLogTestTruncated *this)

{
  Test *pTVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  LoadStatus LVar5;
  Node *pNVar6;
  pointer ppDVar7;
  ulong size;
  ulong uVar8;
  StringPiece path;
  StringPiece path_00;
  StringPiece path_01;
  StringPiece path_02;
  StringPiece path_03;
  StringPiece path_04;
  vector<Node_*,_std::allocator<Node_*>_> deps;
  string err;
  State state;
  stat st;
  int local_27c;
  string local_278;
  undefined1 local_250 [32];
  _func_int **local_230;
  undefined1 local_228 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  pointer local_1f8;
  pointer ppNStack_1f0;
  pointer local_1e8;
  pointer ppDStack_1e0;
  pointer local_1d8;
  pointer ppDStack_1d0;
  State local_1c8;
  undefined1 local_c0 [48];
  pointer local_90;
  pointer ppNStack_88;
  pointer local_80;
  pointer ppDStack_78;
  pointer local_70;
  pointer ppDStack_68;
  
  State::State(&local_1c8);
  pTVar1 = g_current_test;
  local_c0._16_8_ = local_c0 + 0x20;
  local_c0[0] = false;
  local_c0._8_8_ = (FILE *)0x0;
  local_c0._24_8_ = 0;
  local_c0[0x20] = '\0';
  local_90 = (pointer)0x0;
  ppNStack_88 = (pointer)0x0;
  local_80 = (pointer)0x0;
  ppDStack_78 = (pointer)0x0;
  local_70 = (pointer)0x0;
  ppDStack_68 = (pointer)0x0;
  local_228._8_8_ = (FILE *)0x0;
  local_228._16_8_ = local_228._16_8_ & 0xffffffffffffff00;
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  local_228._0_8_ = local_228 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"DepsLogTest-tempfile","");
  bVar2 = DepsLog::OpenForWrite((DepsLog *)local_c0,&local_278,(string *)local_228);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
             ,0x168,"log.OpenForWrite(kTestFilename, &err)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  pTVar1 = g_current_test;
  iVar4 = std::__cxx11::string::compare(local_228);
  bVar2 = testing::Test::Check
                    (pTVar1,iVar4 == 0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                     ,0x169,"\"\" == err");
  if (bVar2) {
    local_278._M_dataplus._M_p = (pointer)0x0;
    local_278._M_string_length = 0;
    local_278.field_2._M_allocated_capacity = 0;
    path.len_ = 5;
    path.str_ = "foo.h";
    local_250._0_8_ = State::GetNode(&local_1c8,path,0);
    std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
              ((vector<Node*,std::allocator<Node*>> *)&local_278,(Node **)local_250);
    path_00.len_ = 5;
    path_00.str_ = "bar.h";
    local_250._0_8_ = State::GetNode(&local_1c8,path_00,0);
    std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
              ((vector<Node*,std::allocator<Node*>> *)&local_278,(Node **)local_250);
    path_01.len_ = 5;
    path_01.str_ = "out.o";
    pNVar6 = State::GetNode(&local_1c8,path_01,0);
    DepsLog::RecordDeps((DepsLog *)local_c0,pNVar6,1,
                        (vector<Node_*,_std::allocator<Node_*>_> *)&local_278);
    if ((pointer)local_278._M_string_length != local_278._M_dataplus._M_p) {
      local_278._M_string_length = (size_type)local_278._M_dataplus._M_p;
    }
    path_02.len_ = 5;
    path_02.str_ = "foo.h";
    local_250._0_8_ = State::GetNode(&local_1c8,path_02,0);
    std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
              ((vector<Node*,std::allocator<Node*>> *)&local_278,(Node **)local_250);
    path_03.len_ = 6;
    path_03.str_ = "bar2.h";
    local_250._0_8_ = State::GetNode(&local_1c8,path_03,0);
    std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
              ((vector<Node*,std::allocator<Node*>> *)&local_278,(Node **)local_250);
    path_04.len_ = 6;
    path_04.str_ = "out2.o";
    pNVar6 = State::GetNode(&local_1c8,path_04,0);
    DepsLog::RecordDeps((DepsLog *)local_c0,pNVar6,2,
                        (vector<Node_*,_std::allocator<Node_*>_> *)&local_278);
    DepsLog::Close((DepsLog *)local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_278._M_dataplus._M_p,
                      local_278.field_2._M_allocated_capacity - (long)local_278._M_dataplus._M_p);
    }
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
    operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
  }
  DepsLog::~DepsLog((DepsLog *)local_c0);
  if (local_1c8.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c8.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_230 = (_func_int **)&PTR__BindingEnv_001d8ce8;
  local_1c8.bindings_.super_Env._vptr_Env = (_func_int **)&PTR__BindingEnv_001d8ce8;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  ::~_Rb_tree(&local_1c8.bindings_.rules_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1c8.bindings_.bindings_._M_t);
  if (local_1c8.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c8.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
  ::~_Rb_tree(&local_1c8.pools_._M_t);
  std::
  _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_1c8);
  pTVar1 = g_current_test;
  if (bVar2) {
    iVar4 = stat("DepsLogTest-tempfile",(stat *)local_c0);
    bVar2 = testing::Test::Check
                      (pTVar1,iVar4 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                       ,0x17a,"0 == stat(kTestFilename, &st)");
    if (bVar2) {
      if (0 < (int)(uint)local_90) {
        uVar8 = 5;
        local_27c = 2;
        size = (ulong)((uint)local_90 & 0x7fffffff);
        do {
          pTVar1 = g_current_test;
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          local_278._M_string_length = 0;
          local_278.field_2._M_allocated_capacity =
               local_278.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_1c8.paths_._M_h._M_buckets = &local_1c8.paths_._M_h._M_before_begin._M_nxt;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1c8,"DepsLogTest-tempfile","");
          bVar2 = Truncate((string *)&local_1c8,size,&local_278);
          bVar2 = testing::Test::Check
                            (pTVar1,bVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                             ,0x183,"Truncate(kTestFilename, size, &err)");
          if ((__node_base *)local_1c8.paths_._M_h._M_buckets !=
              &local_1c8.paths_._M_h._M_before_begin) {
            operator_delete(local_1c8.paths_._M_h._M_buckets,
                            (ulong)((long)&(local_1c8.paths_._M_h._M_before_begin._M_nxt)->_M_nxt +
                                   1));
          }
          if (bVar2) {
            State::State(&local_1c8);
            pTVar1 = g_current_test;
            local_228._0_8_ = local_228._0_8_ & 0xffffffffffffff00;
            local_228._8_8_ = (FILE *)0x0;
            local_228._16_8_ = &local_208;
            local_228._24_8_ = 0;
            local_208._M_local_buf[0] = '\0';
            local_1d8 = (pointer)0x0;
            ppDStack_1d0 = (pointer)0x0;
            local_1e8 = (pointer)0x0;
            ppDStack_1e0 = (pointer)0x0;
            local_1f8 = (pointer)0x0;
            ppNStack_1f0 = (pointer)0x0;
            local_250._0_8_ = (Node *)(local_250 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_250,"DepsLogTest-tempfile","");
            LVar5 = DepsLog::Load((DepsLog *)local_228,(string *)local_250,&local_1c8,&local_278);
            testing::Test::Check
                      (pTVar1,LVar5 != LOAD_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                       ,0x187,"log.Load(kTestFilename, &state, &err)");
            if ((Node *)local_250._0_8_ != (Node *)(local_250 + 0x10)) {
              operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
            }
            if (local_278._M_string_length == 0) {
              bVar3 = testing::Test::Check
                                (g_current_test,
                                 (int)((ulong)((long)ppNStack_1f0 - (long)local_1f8) >> 3) <=
                                 (int)uVar8,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                 ,0x18d,"node_count >= (int)log.nodes().size()");
              iVar4 = 0;
              bVar2 = false;
              if (bVar3) {
                if (ppDStack_1e0 != local_1d8) {
                  iVar4 = 0;
                  ppDVar7 = ppDStack_1e0;
                  do {
                    iVar4 = (iVar4 + 1) - (uint)(*ppDVar7 == (Deps *)0x0);
                    ppDVar7 = ppDVar7 + 1;
                  } while (ppDVar7 != local_1d8);
                }
                uVar8 = (long)ppNStack_1f0 - (long)local_1f8;
                bVar2 = testing::Test::Check
                                  (g_current_test,iVar4 <= local_27c,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                   ,0x197,"deps_count >= new_deps_count");
                uVar8 = uVar8 >> 3;
                if (bVar2) goto LAB_001541b4;
              }
              g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
              iVar4 = local_27c;
            }
            else {
              bVar2 = false;
              iVar4 = local_27c;
            }
LAB_001541b4:
            DepsLog::~DepsLog((DepsLog *)local_228);
            if (local_1c8.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_1c8.defaults_.
                              super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_1c8.defaults_.
                                    super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_1c8.defaults_.
                                    super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            local_1c8.bindings_.super_Env._vptr_Env = local_230;
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
            ::~_Rb_tree(&local_1c8.bindings_.rules_._M_t);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree(&local_1c8.bindings_.bindings_._M_t);
            if (local_1c8.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_1c8.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_1c8.edges_.
                                    super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_1c8.edges_.
                                    super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
            ::~_Rb_tree(&local_1c8.pools_._M_t);
            std::
            _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)&local_1c8);
            local_27c = iVar4;
          }
          else {
            g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
            bVar2 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          bVar3 = 1 < (long)size;
          size = size - 1;
        } while ((bVar2 & bVar3) != 0);
      }
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
  }
  return;
}

Assistant:

TEST_F(DepsLogTest, Truncated) {
  // Create a file with some entries.
  {
    State state;
    DepsLog log;
    string err;
    EXPECT_TRUE(log.OpenForWrite(kTestFilename, &err));
    ASSERT_EQ("", err);

    vector<Node*> deps;
    deps.push_back(state.GetNode("foo.h", 0));
    deps.push_back(state.GetNode("bar.h", 0));
    log.RecordDeps(state.GetNode("out.o", 0), 1, deps);

    deps.clear();
    deps.push_back(state.GetNode("foo.h", 0));
    deps.push_back(state.GetNode("bar2.h", 0));
    log.RecordDeps(state.GetNode("out2.o", 0), 2, deps);

    log.Close();
  }

  // Get the file size.
  struct stat st;
  ASSERT_EQ(0, stat(kTestFilename, &st));

  // Try reloading at truncated sizes.
  // Track how many nodes/deps were found; they should decrease with
  // smaller sizes.
  int node_count = 5;
  int deps_count = 2;
  for (int size = (int)st.st_size; size > 0; --size) {
    string err;
    ASSERT_TRUE(Truncate(kTestFilename, size, &err));

    State state;
    DepsLog log;
    EXPECT_TRUE(log.Load(kTestFilename, &state, &err));
    if (!err.empty()) {
      // At some point the log will be so short as to be unparseable.
      break;
    }

    ASSERT_GE(node_count, (int)log.nodes().size());
    node_count = log.nodes().size();

    // Count how many non-NULL deps entries there are.
    int new_deps_count = 0;
    for (vector<DepsLog::Deps*>::const_iterator i = log.deps().begin();
         i != log.deps().end(); ++i) {
      if (*i)
        ++new_deps_count;
    }
    ASSERT_GE(deps_count, new_deps_count);
    deps_count = new_deps_count;
  }
}